

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.cpp
# Opt level: O3

vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_> * __thiscall
cfd::core::Transaction::GetTxOutList
          (vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
           *__return_storage_ptr__,Transaction *this)

{
  pointer pTVar1;
  pointer pTVar2;
  TxOut tx_out;
  AbstractTxOut local_d0;
  AbstractTxOutReference local_80;
  
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>)._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>)._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>)._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar2 = (this->vout_).super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pTVar1 = (this->vout_).super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pTVar2 != pTVar1) {
    do {
      local_d0._vptr_AbstractTxOut = (_func_int **)&PTR__AbstractTxOut_0072e7f0;
      local_d0.value_.amount_ = (pTVar2->super_AbstractTxOut).value_.amount_;
      local_d0.value_.ignore_check_ = (pTVar2->super_AbstractTxOut).value_.ignore_check_;
      local_d0.value_._9_7_ = *(undefined7 *)&(pTVar2->super_AbstractTxOut).value_.field_0x9;
      Script::Script(&local_d0.locking_script_,&(pTVar2->super_AbstractTxOut).locking_script_);
      local_d0._vptr_AbstractTxOut = (_func_int **)&PTR__AbstractTxOut_0072e8b8;
      AbstractTxOutReference::AbstractTxOutReference(&local_80,&local_d0);
      local_80._vptr_AbstractTxOutReference = (_func_int **)&PTR__AbstractTxOutReference_0072e8e0;
      ::std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>::
      emplace_back<cfd::core::TxOutReference>(__return_storage_ptr__,(TxOutReference *)&local_80);
      local_80._vptr_AbstractTxOutReference = (_func_int **)&PTR__AbstractTxOutReference_00723740;
      Script::~Script(&local_80.locking_script_);
      local_d0._vptr_AbstractTxOut = (_func_int **)&PTR__AbstractTxOut_0072e7f0;
      Script::~Script(&local_d0.locking_script_);
      pTVar2 = pTVar2 + 1;
    } while (pTVar2 != pTVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::vector<TxOutReference> Transaction::GetTxOutList() const {
  std::vector<TxOutReference> refs;
  for (TxOut tx_out : vout_) {
    refs.push_back(TxOutReference(tx_out));
  }
  return refs;
}